

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O1

PsocksDataSink * open_pipes(char *cmd,char **direction_args,char *index_arg,char **err)

{
  char *__command;
  FILE *pFVar1;
  int *piVar2;
  char *pcVar3;
  stdio_sink *psVar4;
  stdio_sink *psVar5;
  size_t i_1;
  size_t i_2;
  size_t i;
  long lVar6;
  FILE *fp [2];
  undefined8 auStack_48 [3];
  
  pcVar3 = (char *)0x0;
  lVar6 = 0;
  do {
    __command = dupprintf("%s %s %s",cmd,direction_args[lVar6]);
    pFVar1 = popen(__command,"w");
    auStack_48[lVar6] = pFVar1;
    safefree(__command);
    if (pFVar1 == (FILE *)0x0 && pcVar3 == (char *)0x0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      pcVar3 = dupprintf("%s",pcVar3);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  if (pcVar3 == (char *)0x0) {
    lVar6 = 0;
    psVar5 = (stdio_sink *)safemalloc(1,0x58,0);
    psVar4 = psVar5;
    do {
      pFVar1 = (FILE *)auStack_48[lVar6];
      setvbuf(pFVar1,(char *)0x0,2,0);
      stdio_sink_init(psVar4,(FILE *)pFVar1);
      (&psVar5[2].binarysink_[0].write)[lVar6] =
           (_func_void_BinarySink_ptr_void_ptr_size_t *)psVar4->binarysink_;
      lVar6 = lVar6 + 1;
      psVar4 = psVar4 + 1;
    } while (lVar6 == 1);
    psVar4 = psVar5 + 2;
    psVar5[2].fp = (FILE *)popen_free;
  }
  else {
    lVar6 = 0;
    do {
      if ((FILE *)auStack_48[lVar6] != (FILE *)0x0) {
        pclose((FILE *)auStack_48[lVar6]);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    *err = pcVar3;
    psVar4 = (stdio_sink *)0x0;
  }
  return (PsocksDataSink *)psVar4;
}

Assistant:

static PsocksDataSink *open_pipes(
    const char *cmd, const char *const *direction_args,
    const char *index_arg, char **err)
{
    FILE *fp[2];
    char *errmsg = NULL;

    for (size_t i = 0; i < 2; i++) {
        /* No escaping needed: the provided command is already
         * shell-quoted, and our extra arguments are simple */
        char *command = dupprintf("%s %s %s", cmd,
                                  direction_args[i], index_arg);

        fp[i] = popen(command, "w");
        sfree(command);

        if (!fp[i]) {
            if (!errmsg)
                errmsg = dupprintf("%s", strerror(errno));
        }
    }

    if (errmsg) {
        for (size_t i = 0; i < 2; i++)
            if (fp[i])
                pclose(fp[i]);
        *err = errmsg;
        return NULL;
    }

    PsocksDataSinkPopen *pdsp = snew(PsocksDataSinkPopen);

    for (size_t i = 0; i < 2; i++) {
        setvbuf(fp[i], NULL, _IONBF, 0);
        stdio_sink_init(&pdsp->sink[i], fp[i]);
        pdsp->pds.s[i] = BinarySink_UPCAST(&pdsp->sink[i]);
    }

    pdsp->pds.free = popen_free;

    return &pdsp->pds;
}